

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O3

Reg __thiscall backend::codegen::Codegen::get_or_alloc_vd(Codegen *this,VarId *v_)

{
  _Rb_tree_header *p_Var1;
  uint32_t num;
  Reg RVar2;
  RegisterKind RVar3;
  _Base_ptr p_Var4;
  _Base_ptr p_Var5;
  bool bVar6;
  VarId v;
  pair<const_mir::inst::VarId,_unsigned_int> local_68;
  undefined **local_50;
  uint32_t local_48;
  uint local_38;
  
  local_50 = &PTR_display_001eb100;
  local_48 = v_->id;
  get_collapsed_var((Codegen *)&stack0xffffffffffffffc0,(VarId *)this);
  p_Var4 = (this->reg_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  if (p_Var4 != (_Base_ptr)0x0) {
    p_Var1 = &(this->reg_map)._M_t._M_impl.super__Rb_tree_header;
    p_Var5 = &p_Var1->_M_header;
    do {
      bVar6 = *(uint *)&p_Var4[1]._M_parent < local_38;
      if (!bVar6) {
        p_Var5 = p_Var4;
      }
      p_Var4 = (&p_Var4->_M_left)[bVar6];
    } while (p_Var4 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)p_Var5 != p_Var1) && (*(uint *)&p_Var5[1]._M_parent <= local_38)) {
      RVar3 = arm::register_type(*(Reg *)&p_Var5[1]._M_left);
      if (RVar3 == VirtualDoubleVector) {
        return *(Reg *)&p_Var5[1]._M_left;
      }
      __assert_fail("arm::register_type(found->second) == arm::RegisterKind::VirtualDoubleVector",
                    "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/codegen/codegen.cpp"
                    ,0x135,"arm::Reg backend::codegen::Codegen::get_or_alloc_vd(mir::inst::VarId)");
    }
  }
  num = this->vreg_vd_counter;
  this->vreg_vd_counter = num + 1;
  RVar2 = arm::make_register(VirtualDoubleVector,num);
  local_68.first.super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001eb100;
  local_68.first.id = local_38;
  local_68.second = RVar2;
  std::
  _Rb_tree<mir::inst::VarId,std::pair<mir::inst::VarId_const,unsigned_int>,std::_Select1st<std::pair<mir::inst::VarId_const,unsigned_int>>,std::less<mir::inst::VarId>,std::allocator<std::pair<mir::inst::VarId_const,unsigned_int>>>
  ::_M_insert_unique<std::pair<mir::inst::VarId_const,unsigned_int>>
            ((_Rb_tree<mir::inst::VarId,std::pair<mir::inst::VarId_const,unsigned_int>,std::_Select1st<std::pair<mir::inst::VarId_const,unsigned_int>>,std::less<mir::inst::VarId>,std::allocator<std::pair<mir::inst::VarId_const,unsigned_int>>>
              *)&this->reg_map,&local_68);
  local_68.first.id = v_->id;
  if (local_68.first.id != local_38) {
    local_68.first.super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001eb100;
    local_68.second = RVar2;
    std::
    _Rb_tree<mir::inst::VarId,std::pair<mir::inst::VarId_const,unsigned_int>,std::_Select1st<std::pair<mir::inst::VarId_const,unsigned_int>>,std::less<mir::inst::VarId>,std::allocator<std::pair<mir::inst::VarId_const,unsigned_int>>>
    ::_M_insert_unique<std::pair<mir::inst::VarId_const,unsigned_int>>
              ((_Rb_tree<mir::inst::VarId,std::pair<mir::inst::VarId_const,unsigned_int>,std::_Select1st<std::pair<mir::inst::VarId_const,unsigned_int>>,std::less<mir::inst::VarId>,std::allocator<std::pair<mir::inst::VarId_const,unsigned_int>>>
                *)&this->reg_map,&local_68);
  }
  return RVar2;
}

Assistant:

arm::Reg Codegen::get_or_alloc_vd(mir::inst::VarId v_) {
  auto v = get_collapsed_var(v_);
  auto found = reg_map.find(v);
  if (found != reg_map.end()) {
    assert(arm::register_type(found->second) ==
           arm::RegisterKind::VirtualDoubleVector);
    return found->second;
  } else {
    auto reg = alloc_vd();
    reg_map.insert({v, reg});
    if (v_ != v) reg_map.insert({v_, reg});
    return reg;
  }
}